

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::makeMemoryGrow<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  undefined8 *puVar1;
  _Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *mem_00;
  undefined1 local_a0 [8];
  MaybeResult<wasm::Name> mem;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  MaybeResult<wasm::Name> _val;
  
  maybeMemidx<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Name> *)local_a0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_58,
                  (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_a0);
  if (_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
    mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ = &local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),local_58,
               _val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._M_first.
               _M_storage.super_IString.str._M_len + (long)local_58);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if ((undefined8 *)
        mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_ == &local_68) {
      *puVar1 = local_68;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_60;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_68;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_70;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_58);
    mem_00 = (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)0x0;
    if (mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::None,_wasm::Err>._M_u._24_1_ == '\0') {
      mem_00 = (_Copy_ctor_base<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_a0;
    }
    ParseDefsCtx::makeMemoryGrow(__return_storage_ptr__,ctx,pos,annotations,(Name *)mem_00);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Name,_wasm::None,_wasm::Err> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeMemoryGrow(Ctx& ctx,
                        Index pos,
                        const std::vector<Annotation>& annotations) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  return ctx.makeMemoryGrow(pos, annotations, mem.getPtr());
}